

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
pstack::ReaderArray<unsigned_long,_131072UL>::ReaderArray
          (ReaderArray<unsigned_long,_131072UL> *this,Reader *reader_,size_t offset)

{
  long lVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  ulong uVar4;
  Exception *this_00;
  Exception *rhs;
  Exception local_1c0;
  size_t local_20;
  size_t offset_local;
  Reader *reader__local;
  ReaderArray<unsigned_long,_131072UL> *this_local;
  
  this->reader = reader_;
  this->base = offset;
  this->cacheStart = 0;
  this->cacheEnd = 0;
  local_20 = offset;
  offset_local = (size_t)reader_;
  reader__local = (Reader *)this;
  lVar1 = (**(code **)(*(long *)this->reader + 0x40))();
  this->eof = lVar1 - this->base >> 3;
  uVar2 = (**(code **)(*(long *)this->reader + 0x40))();
  uVar3 = std::numeric_limits<unsigned_long>::max();
  if (uVar2 != uVar3) {
    uVar4 = (**(code **)(*(long *)this->reader + 0x40))();
    if ((uVar4 & 7) != 0) {
      this_00 = (Exception *)__cxa_allocate_exception();
      memset(&local_1c0,0,0x1a0);
      Exception::Exception(&local_1c0);
      rhs = Exception::operator<<(&local_1c0,(char (*) [32])"end of data while reading array");
      Exception::Exception(this_00,rhs);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
  }
  return;
}

Assistant:

ReaderArray(const Reader &reader_, size_t offset = 0) :
         reader(reader_),
         base(offset),
         eof( ( reader.size() - base ) / sizeof(T) ) {
      if(reader.size() != std::numeric_limits<size_t>::max() && reader.size() % sizeof (T) != 0) {
         throw ( Exception() << "end of data while reading array" );
      }
   }